

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O2

void __thiscall Population::~Population(Population *this)

{
  this->_vptr_Population = (_func_int **)&PTR_update_001308c8;
  std::_Vector_base<Neuron_*,_std::allocator<Neuron_*>_>::~_Vector_base
            (&(this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>);
  std::_Vector_base<Event_*,_std::allocator<Event_*>_>::~_Vector_base
            (&(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>);
  return;
}

Assistant:

virtual ~Population() {}